

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_drawing.h
# Opt level: O2

void core::image::draw_circle<unsigned_char>
               (Image<unsigned_char> *image,int x,int y,int radius,uchar *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  pointer puVar13;
  long lVar14;
  long lVar15;
  ptrdiff_t _Num;
  size_t __n;
  
  iVar1 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  __n = (size_t)iVar1;
  iVar4 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  iVar11 = iVar4 * iVar1;
  lVar5 = (long)((y * iVar4 + x) * iVar1);
  puVar13 = (image->super_TypedImageBase<unsigned_char>).data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(puVar13 + (lVar5 - iVar11 * radius),color,__n);
    memmove(puVar13 + (lVar5 - iVar1 * radius),color,__n);
    memmove(puVar13 + iVar1 * radius + lVar5,color,__n);
    memmove(puVar13 + iVar11 * radius + lVar5,color,__n);
  }
  iVar4 = 1;
  iVar9 = 1 - radius;
  iVar10 = radius * -2;
  lVar6 = (long)iVar11;
  lVar12 = (long)puVar13 - lVar6;
  lVar7 = (long)puVar13 - __n;
  lVar14 = 0;
  puVar8 = puVar13;
  while( true ) {
    puVar8 = puVar8 + lVar6;
    puVar13 = puVar13 + __n;
    if (radius <= lVar14) break;
    iVar3 = iVar10 + 2;
    iVar2 = 0;
    if (-1 < iVar9) {
      iVar10 = iVar3;
      iVar2 = iVar3;
    }
    radius = radius - (uint)(-1 < iVar9);
    if (iVar1 != 0) {
      lVar15 = lVar5 + radius * iVar11;
      memmove(puVar13 + lVar15,color,__n);
      memmove((void *)(lVar15 + lVar7),color,__n);
      lVar15 = lVar5 - radius * iVar11;
      memmove(puVar13 + lVar15,color,__n);
      memmove((void *)(lVar15 + lVar7),color,__n);
      lVar15 = lVar5 + iVar1 * radius;
      memmove(puVar8 + lVar15,color,__n);
      memmove((void *)(lVar15 + lVar12),color,__n);
      lVar15 = lVar5 - iVar1 * radius;
      memmove(puVar8 + lVar15,color,__n);
      memmove((void *)(lVar15 + lVar12),color,__n);
    }
    iVar9 = iVar9 + iVar4;
    iVar4 = iVar4 + 2;
    iVar9 = iVar9 + 2 + iVar2;
    lVar12 = lVar12 - lVar6;
    lVar7 = lVar7 - __n;
    lVar14 = lVar14 + 1;
  }
  return;
}

Assistant:

void
draw_circle (Image<T>& image, int x, int y, int radius, T const* color)
{
    /* http://en.wikipedia.org/wiki/Bresenham_circle */
    int const chans = image.channels();
    int const row_stride = image.width() * chans;
    T* const ptr = &image.at(x, y, 0);
    std::copy(color, color + chans, ptr - radius * row_stride);
    std::copy(color, color + chans, ptr - radius * chans);
    std::copy(color, color + chans, ptr + radius * chans);
    std::copy(color, color + chans, ptr + radius * row_stride);

    int f = 1 - radius;
    int ddf_x = 1;
    int ddf_y = -2 * radius;
    int xi = 0;
    int yi = radius;
    while (xi < yi)
    {
        if (f >= 0)
        {
            yi--;
            ddf_y += 2;
            f += ddf_y;
        }
        xi++;
        ddf_x += 2;
        f += ddf_x;

        std::copy(color, color + chans, ptr + xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr + xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr + xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr + xi * row_stride - yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride - yi * chans);
    }
}